

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O3

Pipeline *
buildEmptyPipelineModel
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,TensorAttributes *outTensorAttr)

{
  RepeatedField<long> *pRVar1;
  ulong uVar2;
  Rep *pRVar3;
  ModelDescription *pMVar4;
  FeatureType *pFVar5;
  long *plVar6;
  FeatureDescription *pFVar7;
  void *pvVar8;
  ArrayFeatureType *pAVar9;
  Pipeline *pPVar10;
  undefined8 *puVar11;
  int iVar12;
  uint uVar13;
  Arena *pAVar14;
  
  pMVar4 = m->description_;
  if (pMVar4 == (ModelDescription *)0x0) {
    uVar2 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar14 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar14 = *(Arena **)pAVar14;
    }
    pMVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar14);
    m->description_ = pMVar4;
  }
  pRVar3 = (pMVar4->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_001dfa56:
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pMVar4->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar8 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                       (&(pMVar4->input_).super_RepeatedPtrFieldBase,pFVar7);
  }
  else {
    iVar12 = (pMVar4->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar12) goto LAB_001dfa56;
    (pMVar4->input_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
    pvVar8 = pRVar3->elements[iVar12];
  }
  puVar11 = (undefined8 *)(*(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar8 + 8) & 1) != 0) {
    puVar11 = (undefined8 *)*puVar11;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar8 + 0x10),inTensorAttr->name,puVar11);
  pFVar5 = *(FeatureType **)((long)pvVar8 + 0x20);
  if (pFVar5 == (FeatureType *)0x0) {
    pAVar14 = (Arena *)(*(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar8 + 8) & 1) != 0) {
      pAVar14 = *(Arena **)pAVar14;
    }
    pFVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar14);
    *(FeatureType **)((long)pvVar8 + 0x20) = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar5->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    uVar2 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar14 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar14 = *(Arena **)pAVar14;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar14);
    (pFVar5->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9->datatype_ = 0x10020;
  if (0 < inTensorAttr->dimension) {
    pRVar1 = &pAVar9->shape_;
    uVar13 = (pAVar9->shape_).current_size_;
    iVar12 = 0;
    do {
      if (uVar13 == (pAVar9->shape_).total_size_) {
        google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar13 + 1);
        plVar6 = google::protobuf::RepeatedField<long>::elements(pRVar1);
        plVar6[uVar13] = 1;
      }
      else {
        plVar6 = google::protobuf::RepeatedField<long>::elements(pRVar1);
        plVar6[uVar13] = 1;
      }
      uVar13 = uVar13 + 1;
      pRVar1->current_size_ = uVar13;
      iVar12 = iVar12 + 1;
    } while (iVar12 < inTensorAttr->dimension);
  }
  pMVar4 = m->description_;
  if (pMVar4 == (ModelDescription *)0x0) {
    uVar2 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar14 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar14 = *(Arena **)pAVar14;
    }
    pMVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar14);
    m->description_ = pMVar4;
  }
  pRVar3 = (pMVar4->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 != (Rep *)0x0) {
    iVar12 = (pMVar4->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar12 < pRVar3->allocated_size) {
      (pMVar4->output_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
      pvVar8 = pRVar3->elements[iVar12];
      goto LAB_001dfbca;
    }
  }
  pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                     ((pMVar4->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar8 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                     (&(pMVar4->output_).super_RepeatedPtrFieldBase,pFVar7);
LAB_001dfbca:
  puVar11 = (undefined8 *)(*(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar8 + 8) & 1) != 0) {
    puVar11 = (undefined8 *)*puVar11;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar8 + 0x10),outTensorAttr->name,puVar11);
  pFVar5 = *(FeatureType **)((long)pvVar8 + 0x20);
  if (pFVar5 == (FeatureType *)0x0) {
    pAVar14 = (Arena *)(*(ulong *)((long)pvVar8 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar8 + 8) & 1) != 0) {
      pAVar14 = *(Arena **)pAVar14;
    }
    pFVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar14);
    *(FeatureType **)((long)pvVar8 + 0x20) = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar5->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    uVar2 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar14 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar14 = *(Arena **)pAVar14;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar14);
    (pFVar5->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9->datatype_ = 0x10020;
  if (0 < outTensorAttr->dimension) {
    pRVar1 = &pAVar9->shape_;
    uVar13 = (pAVar9->shape_).current_size_;
    iVar12 = 0;
    do {
      if (uVar13 == (pAVar9->shape_).total_size_) {
        google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar13 + 1);
        plVar6 = google::protobuf::RepeatedField<long>::elements(pRVar1);
        plVar6[uVar13] = 1;
      }
      else {
        plVar6 = google::protobuf::RepeatedField<long>::elements(pRVar1);
        plVar6[uVar13] = 1;
      }
      uVar13 = uVar13 + 1;
      pRVar1->current_size_ = uVar13;
      iVar12 = iVar12 + 1;
    } while (iVar12 < outTensorAttr->dimension);
  }
  m->specificationversion_ = 4;
  if (m->_oneof_case_[0] == 0xca) {
    pPVar10 = (Pipeline *)(m->Type_).pipelineclassifier_;
  }
  else {
    CoreML::Specification::Model::clear_Type(m);
    m->_oneof_case_[0] = 0xca;
    uVar2 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar14 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar14 = *(Arena **)pAVar14;
    }
    pPVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Pipeline>(pAVar14);
    (m->Type_).pipeline_ = pPVar10;
  }
  if (isUpdatable) {
    m->isupdatable_ = true;
  }
  return pPVar10;
}

Assistant:

Specification::Pipeline* buildEmptyPipelineModel(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, const TensorAttributes *outTensorAttr) {
    auto inTensor = m.mutable_description()->add_input();
    inTensor->set_name(inTensorAttr->name);
    auto inTensorShape = inTensor->mutable_type()->mutable_multiarraytype();
    inTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        inTensorShape->add_shape(1);
    }
    
    auto outTensor = m.mutable_description()->add_output();
    outTensor->set_name(outTensorAttr->name);
    auto outTensorShape = outTensor->mutable_type()->mutable_multiarraytype();
    outTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < outTensorAttr->dimension; i++) {
        outTensorShape->add_shape(1);
    }
    
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    
    auto pipeline = m.mutable_pipeline();
    
    if (isUpdatable) {
        m.set_isupdatable(true);
    }
    
    return pipeline;
}